

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::greater<void>>>,std::vector<int,std::allocator<int>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::greater<void>_>_>
          *lhs,char *op,vector<int,_std::allocator<int>_> *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  toStream<boost::iterator_range<burst::difference_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::greater<void>>>>
            (&local_40,this,lhs);
  String::String(&local_58,(char *)lhs);
  doctest::operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  doctest::operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }